

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::flipnm_post
          (tetgenmesh *this,triface *abtets,int n,int nn,int abedgepivot,flipconstraints *fc)

{
  long *plVar1;
  long lVar2;
  triface *ptVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  triface *ptVar9;
  int *piVar10;
  flipconstraints *fc_00;
  triface *t1;
  ulong uVar11;
  uint uVar12;
  uint abedgepivot_00;
  flipconstraints *local_80;
  triface local_78;
  tetrahedron *local_68;
  int local_60;
  ulong local_58;
  int local_50;
  triface *local_40;
  long local_38;
  
  lVar2 = 8;
  do {
    *(undefined8 *)((long)&local_80 + lVar2) = 0;
    *(undefined4 *)((long)&local_78.tet + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x38);
  local_80 = fc;
  if (((nn == 2) && (nn = 3, fc->unflip != 0)) &&
     (flip23(this,abtets,1,fc), fc->collectnewtets != 0)) {
    plVar1 = &this->cavetetlist->objects;
    *plVar1 = *plVar1 + (-1 - (ulong)(abedgepivot == 0));
  }
  uVar11 = (ulong)nn;
  local_38 = (long)n;
  ptVar9 = abtets + uVar11;
  fc_00 = local_80;
  for (; (long)uVar11 < local_38; uVar11 = uVar11 + 1) {
    uVar12 = abtets[uVar11].ver;
    uVar5 = uVar12 >> 4 & 3;
    iVar7 = (int)uVar11;
    if (uVar5 == 2) {
      ptVar3 = (triface *)abtets[uVar11].tet;
      uVar5 = uVar12 >> 0x13;
      abedgepivot_00 = uVar12 & 3;
      local_40 = ptVar9;
      if (fc_00->unflip == 0) {
        flipnm_post(this,ptVar3,uVar5,2,abedgepivot_00,fc_00);
      }
      else {
        uVar12 = uVar12 >> 6 & 0x1fff;
        if (2 < this->b->verbose) {
          printf("      Recover a %d-to-m flip at e[%d] of f[%d].\n",(ulong)uVar5,
                 (ulong)abedgepivot_00,(ulong)uVar12);
        }
        ptVar9 = abtets + (int)(iVar7 + uVar12 + -1) % iVar7;
        if (abedgepivot_00 == 1) {
          ptVar3->tet = ptVar9->tet;
          iVar6 = ptVar9->ver;
          ptVar3->ver = iVar6;
          iVar6 = eprevtbl[iVar6];
          ptVar3->ver = iVar6;
          iVar6 = esymtbl[iVar6];
          ptVar3->ver = iVar6;
          ptVar3->ver = eprevtbl[iVar6];
          ptVar9 = ptVar3 + 1;
          t1 = ptVar3;
        }
        else {
          t1 = ptVar3 + 1;
          ptVar3[1].tet = ptVar9->tet;
          iVar6 = ptVar9->ver;
          ptVar3[1].ver = iVar6;
          iVar6 = enexttbl[iVar6];
          ptVar3[1].ver = iVar6;
          iVar6 = esymtbl[iVar6];
          ptVar3[1].ver = iVar6;
          ptVar3[1].ver = enexttbl[iVar6];
          ptVar9 = ptVar3;
        }
        fsym(this,t1,ptVar9);
        ptVar9 = abtets + (uVar11 & 0xffffffff);
        flipnm_post(this,ptVar3,uVar5,2,abedgepivot_00,local_80);
        for (uVar8 = uVar11 & 0xffffffff; (int)uVar12 < (int)uVar8; uVar8 = (ulong)((int)uVar8 - 1))
        {
          ptVar9->tet = ptVar9[-1].tet;
          ptVar9->ver = ptVar9[-1].ver;
          ptVar9 = ptVar9 + -1;
        }
        local_78.tet = ptVar3[1].tet;
        piVar4 = eprevtbl;
        piVar10 = enexttbl;
        if (abedgepivot_00 == 1) {
          piVar4 = enexttbl;
          piVar10 = eprevtbl;
        }
        local_78.ver = esymtbl[piVar4[ptVar3[1].ver]];
        local_68 = ptVar3->tet;
        local_60 = piVar10[esymtbl[ptVar3->ver]];
        iVar7 = (int)(uVar12 + iVar7) % (iVar7 + 1);
        abtets[iVar7].tet = local_78.tet;
        abtets[iVar7].ver = local_78.ver;
        *(tetrahedron **)((long)&abtets->tet + (ulong)(uVar12 << 4)) = local_68;
        *(int *)((long)&abtets->ver + (ulong)(uVar12 << 4)) = local_60;
        fc_00 = local_80;
      }
      if (2 < this->b->verbose) {
        printf("      Release %d spaces at f[%d].\n",(ulong)uVar5,uVar11 & 0xffffffff);
      }
      ptVar9 = local_40;
      if (ptVar3 != (triface *)0x0) {
        operator_delete__(ptVar3);
      }
    }
    else if ((uVar5 == 1) && (fc_00->unflip != 0)) {
      uVar12 = (int)uVar12 >> 6;
      if (2 < this->b->verbose) {
        printf("      Recover a 2-to-3 flip at f[%d].\n",(ulong)uVar12);
      }
      iVar6 = (int)(iVar7 + uVar12 + -1) % iVar7;
      local_78.tet = abtets[iVar6].tet;
      local_78.ver = enexttbl[esymtbl[eprevtbl[abtets[iVar6].ver]]];
      local_68 = (tetrahedron *)((ulong)local_78.tet[facepivot1[local_78.ver]] & 0xfffffffffffffff0)
      ;
      local_60 = facepivot2[local_78.ver][(uint)local_78.tet[facepivot1[local_78.ver]] & 0xf];
      local_58 = (ulong)local_68[facepivot1[local_60]] & 0xfffffffffffffff0;
      local_50 = facepivot2[local_60][(uint)local_68[facepivot1[local_60]] & 0xf];
      flip32(this,&local_78,1,fc_00);
      lVar2 = (long)(int)uVar12;
      ptVar3 = ptVar9;
      for (uVar8 = uVar11; lVar2 < (long)uVar8; uVar8 = uVar8 - 1) {
        ptVar3->tet = ptVar3[-1].tet;
        ptVar3->ver = ptVar3[-1].ver;
        ptVar3 = ptVar3 + -1;
      }
      iVar7 = (int)(uVar12 + iVar7) % (iVar7 + 1);
      abtets[iVar7].tet = local_68;
      abtets[iVar7].ver = esymtbl[local_60];
      abtets[lVar2].tet = local_78.tet;
      abtets[lVar2].ver = local_78.ver;
      if (fc_00->collectnewtets != 0) {
        plVar1 = &this->cavetetlist->objects;
        *plVar1 = *plVar1 + -2;
      }
    }
    ptVar9 = ptVar9 + 1;
  }
  return 1;
}

Assistant:

int tetgenmesh::flipnm_post(triface* abtets, int n, int nn, int abedgepivot,
                            flipconstraints* fc)
{
  triface fliptets[3], flipface;
  triface *tmpabtets;
  int fliptype;
  int edgepivot;
  int t, n1;
  int i, j;


  if (nn == 2) {
    // The edge [a,b] has been flipped.
    // 'abtets[0]' is [c,d,e,b] or [#,#,#,b].
    // 'abtets[1]' is [d,c,e,a] or [#,#,#,a].
    if (fc->unflip) {
      // Do a 2-to-3 flip to recover the edge [a,b]. There may be hull tets.
      flip23(abtets, 1, fc);
      if (fc->collectnewtets) {
        // Pop up new (flipped) tets from the stack.
        if (abedgepivot == 0) {
          // Two new tets were collected.
          cavetetlist->objects -= 2;
        } else {
          // Only one of the two new tets was collected.
          cavetetlist->objects -= 1;
        }
      }
    } 
    // The initial size of Star(ab) is 3.
    nn++;
  } 

  // Walk through the performed flips.
  for (i = nn; i < n; i++) {
    // At the beginning of each step 'i', the size of the Star([a,b]) is 'i'.
    // At the end of this step, the size of the Star([a,b]) is 'i+1'.
    // The sizes of the Link([a,b]) are the same.
    fliptype = ((abtets[i].ver >> 4) & 3); // 0, 1, or 2.
    if (fliptype == 1) {
      // It was a 2-to-3 flip: [a,b,c]->[e,d].
      t = (abtets[i].ver >> 6);
      if (fc->unflip) {
        if (b->verbose > 2) {
          printf("      Recover a 2-to-3 flip at f[%d].\n", t);
        }
        // 'abtets[(t-1)%i]' is the tet [a,b,e,d] in current Star(ab), i.e.,
        //   it is created by a 2-to-3 flip [a,b,c] => [e,d].
        fliptets[0] = abtets[((t - 1) + i) % i]; // [a,b,e,d]
        eprevself(fliptets[0]);
        esymself(fliptets[0]);
        enextself(fliptets[0]); // [e,d,a,b]
        fnext(fliptets[0], fliptets[1]); // [e,d,b,c]
        fnext(fliptets[1], fliptets[2]); // [e,d,c,a]
        // Do a 3-to-2 flip: [e,d] => [a,b,c].
        // NOTE: hull tets may be invloved.
        flip32(fliptets, 1, fc);
        // Expand the array 'abtets', maintain the original order.
        // The new array length is (i+1).
        for (j = i - 1; j >= t; j--) {
          abtets[j + 1] = abtets[j];  // Downshift
        }
        // The tet abtets[(t-1)%i] is deleted. Insert the two new tets 
        //   'fliptets[0]' [a,b,c,d] and 'fliptets[1]' [b,a,c,e] into
        //   the (t-1)-th and t-th entries, respectively.
        esym(fliptets[1], abtets[((t-1) + (i+1)) % (i+1)]); // [a,b,e,c]
        abtets[t] = fliptets[0]; // [a,b,c,d]
        if (fc->collectnewtets) {
          // Pop up two (flipped) tets from the stack.
          cavetetlist->objects -= 2;
        }
      } 
    } else if (fliptype == 2) {
      tmpabtets = (triface *) (abtets[i].tet);
      n1 = ((abtets[i].ver >> 19) & 8191); // \sum_{i=0^12}{2^i} = 8191
      edgepivot = (abtets[i].ver & 3); 
      t = ((abtets[i].ver >> 6) & 8191);
      if (fc->unflip) {        
        if (b->verbose > 2) {
          printf("      Recover a %d-to-m flip at e[%d] of f[%d].\n", n1, 
                 edgepivot, t);
        }
        // Recover the flipped edge ([c,b] or [a,c]).
        // abtets[(t - 1 + i) % i] is [a,b,e,d], i.e., the tet created by
        //   the flipping of edge [c,b] or [a,c]. It must still exist in
        //   Star(ab). Use it to recover the flipped edge.
        if (edgepivot == 1) { 
          // The flip edge is [c,b].
          tmpabtets[0] = abtets[(t - 1 + i) % i]; // [a,b,e,d]
          eprevself(tmpabtets[0]);
          esymself(tmpabtets[0]);
          eprevself(tmpabtets[0]); // [d,a,e,b]
          fsym(tmpabtets[0], tmpabtets[1]); // [a,d,e,c]
        } else {
          // The flip edge is [a,c].
          tmpabtets[1] = abtets[(t - 1 + i) % i]; // [a,b,e,d]
          enextself(tmpabtets[1]);
          esymself(tmpabtets[1]);
          enextself(tmpabtets[1]); // [b,d,e,a]
          fsym(tmpabtets[1], tmpabtets[0]); // [d,b,e,c]
        } // if (edgepivot == 2)

        // Do a n1-to-m1 flip to recover the flipped edge ([c,b] or [a,c]).
        flipnm_post(tmpabtets, n1, 2, edgepivot, fc);

        // Insert the two recovered tets into the original Star(ab).
        for (j = i - 1; j >= t; j--) {
          abtets[j + 1] = abtets[j];  // Downshift
        }
        if (edgepivot == 1) {
          // tmpabtets[0] is [c,b,d,a] ==> contains [a,b]
          // tmpabtets[1] is [c,b,a,e] ==> contains [a,b]
          // tmpabtets[2] is [c,b,e,d]
          fliptets[0] = tmpabtets[1];
          enextself(fliptets[0]);
          esymself(fliptets[0]); // [a,b,e,c]
          fliptets[1] = tmpabtets[0];
          esymself(fliptets[1]);
          eprevself(fliptets[1]); // [a,b,c,d]
        } else {
          // tmpabtets[0] is [a,c,d,b] ==> contains [a,b]
          // tmpabtets[1] is [a,c,b,e] ==> contains [a,b]
          // tmpabtets[2] is [a,c,e,d]
          fliptets[0] = tmpabtets[1];
          eprevself(fliptets[0]);
          esymself(fliptets[0]); // [a,b,e,c]
          fliptets[1] = tmpabtets[0];
          esymself(fliptets[1]);
          enextself(fliptets[1]); // [a,b,c,d]
        } // edgepivot == 2
        // Insert the two recovered tets into Star(ab).
        abtets[((t-1) + (i+1)) % (i+1)] = fliptets[0];
        abtets[t] = fliptets[1];
      } 
      else {
        // Only free the spaces.
        flipnm_post(tmpabtets, n1, 2, edgepivot, fc);
      } // if (!unflip)
      if (b->verbose > 2) {
        printf("      Release %d spaces at f[%d].\n", n1, i);
      }
      delete [] tmpabtets;
    }
  } // i

  return 1;
}